

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O0

void irr::video::CColorConverter::convert16BitTo16Bit
               (s16 *in,s16 *out,s32 width,s32 height,s32 linepad,bool flip)

{
  byte bVar1;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  int in_R8D;
  byte in_R9B;
  s32 y;
  int local_24;
  void *local_10;
  void *local_8;
  
  bVar1 = in_R9B & 1;
  if ((in_RDI != (void *)0x0) && (in_RSI != (void *)0x0)) {
    local_10 = in_RSI;
    if (bVar1 != 0) {
      local_10 = (void *)((long)in_RSI + (long)(in_EDX * in_ECX) * 2);
    }
    local_8 = in_RDI;
    for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
      if (bVar1 != 0) {
        local_10 = (void *)((long)local_10 + (long)in_EDX * -2);
      }
      memcpy(local_10,local_8,(long)in_EDX << 1);
      if (bVar1 == 0) {
        local_10 = (void *)((long)local_10 + (long)in_EDX * 2);
      }
      local_8 = (void *)((long)local_8 + (long)in_R8D * 2 + (long)in_EDX * 2);
    }
  }
  return;
}

Assistant:

void CColorConverter::convert16BitTo16Bit(const s16 *in, s16 *out, s32 width, s32 height, s32 linepad, bool flip)
{
	if (!in || !out)
		return;

	if (flip)
		out += width * height;

	for (s32 y = 0; y < height; ++y) {
		if (flip)
			out -= width;
#ifdef __BIG_ENDIAN__
		for (s32 x = 0; x < width; ++x)
			out[x] = os::Byteswap::byteswap(in[x]);
#else
		memcpy(out, in, width * sizeof(s16));
#endif
		if (!flip)
			out += width;
		in += width;
		in += linepad;
	}
}